

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::runTest
               (TestLog *log,ResultCollector *results,RenderContext *renderContext,
               BlendState *preCommonBlendState,BlendState *postCommonBlendState,
               vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               *drawBuffers)

{
  int iVar1;
  undefined4 extraout_var;
  size_type sVar2;
  allocator<tcu::TextureLevel> local_a9;
  undefined1 local_a8 [8];
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> refRenderbuffers;
  undefined1 local_80 [8];
  Framebuffer framebuffer;
  RenderbufferVector renderbuffers;
  Functions *gl;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  *drawBuffers_local;
  BlendState *postCommonBlendState_local;
  BlendState *preCommonBlendState_local;
  RenderContext *renderContext_local;
  ResultCollector *results_local;
  TestLog *log_local;
  Functions *gl_00;
  
  iVar1 = (*renderContext->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar1);
  sVar2 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
          ::size(drawBuffers);
  glu::TypedObjectVector<(glu::ObjectType)2>::TypedObjectVector
            ((TypedObjectVector<(glu::ObjectType)2> *)&framebuffer.super_ObjectWrapper.m_object,
             gl_00,sVar2);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)local_80,gl_00);
  sVar2 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
          ::size(drawBuffers);
  std::allocator<tcu::TextureLevel>::allocator(&local_a9);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::vector
            ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)local_a8,sVar2,
             &local_a9);
  std::allocator<tcu::TextureLevel>::~allocator(&local_a9);
  logTestCaseInfo(log,preCommonBlendState,postCommonBlendState,drawBuffers);
  genRenderbuffers(gl_00,drawBuffers,(Framebuffer *)local_80,
                   (RenderbufferVector *)&framebuffer.super_ObjectWrapper.m_object,
                   (vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)local_a8);
  renderQuad(log,renderContext,preCommonBlendState,postCommonBlendState,drawBuffers,
             (Framebuffer *)local_80,
             (vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)local_a8);
  verifyRenderbuffers(log,results,renderContext,
                      (RenderbufferVector *)&framebuffer.super_ObjectWrapper.m_object,
                      (Framebuffer *)local_80,
                      (vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)local_a8);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::~vector
            ((vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *)local_a8);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)local_80);
  glu::TypedObjectVector<(glu::ObjectType)2>::~TypedObjectVector
            ((TypedObjectVector<(glu::ObjectType)2> *)&framebuffer.super_ObjectWrapper.m_object);
  return;
}

Assistant:

void runTest (TestLog&						log,
			  tcu::ResultCollector&			results,
			  glu::RenderContext&			renderContext,

			  const BlendState&				preCommonBlendState,
			  const BlendState&				postCommonBlendState,
			  const vector<DrawBufferInfo>&	drawBuffers)
{
	const glw::Functions&	gl					= renderContext.getFunctions();
	glu::RenderbufferVector	renderbuffers		(gl, drawBuffers.size());
	glu::Framebuffer		framebuffer			(gl);
	vector<TextureLevel>	refRenderbuffers	(drawBuffers.size());

	logTestCaseInfo(log, preCommonBlendState, postCommonBlendState, drawBuffers);

	genRenderbuffers(gl, drawBuffers, framebuffer, renderbuffers, refRenderbuffers);

	renderQuad(log, renderContext, preCommonBlendState, postCommonBlendState, drawBuffers, framebuffer, refRenderbuffers);

	verifyRenderbuffers(log, results, renderContext, renderbuffers, framebuffer, refRenderbuffers);
}